

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O3

short wabt::interp::SaturatingRoundingQMul<short>(short lhs,short rhs)

{
  long lVar1;
  undefined2 in_register_00000032;
  undefined2 in_register_0000003a;
  
  lVar1 = (long)CONCAT22(in_register_00000032,rhs) * (long)CONCAT22(in_register_0000003a,lhs) +
          0x4000 >> 0xf;
  if (0x7ffe < lVar1) {
    lVar1 = 0x7fff;
  }
  return (short)lVar1;
}

Assistant:

T WABT_VECTORCALL SaturatingRoundingQMul(T lhs, T rhs) {
  constexpr int size_in_bits = sizeof(T) * 8;
  int round_const = 1 << (size_in_bits - 2);
  int64_t product = lhs * rhs;
  product += round_const;
  product >>= (size_in_bits - 1);
  return Saturate<T, int64_t>(product);
}